

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O3

void lore_append_toughness(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  _Bool _Var1;
  monster_sex_t mVar2;
  wchar_t to_hit;
  uint uVar3;
  random_chance in_RAX;
  object *weapon;
  random_chance c;
  random_chance local_38;
  
  local_38 = in_RAX;
  weapon = equipped_item_by_slot_name(player,"weapon");
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) && (lore != (monster_lore *)0x0))
  {
    mVar2 = lore_monster_sex(race);
    if (lore->armour_known == true) {
      textblock_append(tb,"%s has a",
                       *(undefined8 *)
                        (lore_pronoun_nominative_lore_pronouns + (ulong)mVar2 * 0x10 + 8));
      _Var1 = flag_has_dbg(known_flags,0xc,1,"known_flags","RF_UNIQUE");
      if (!_Var1) {
        textblock_append(tb,"n average");
      }
      textblock_append(tb," life rating of ");
      textblock_append_c(tb,'\x0e',"%d",(ulong)(uint)race->avg_hp);
      textblock_append(tb,", and an armor rating of ");
      textblock_append_c(tb,'\x0e',"%d",(ulong)(uint)race->ac);
      textblock_append(tb,".  ");
      to_hit = chance_of_melee_hit_base(player,weapon);
      hit_chance(&local_38,to_hit,race->ac);
      uVar3 = random_chance_scaled(local_38,100);
      textblock_append(tb,"You have a");
      if (uVar3 == 8 || uVar3 - 0x50 < 10) {
        textblock_append(tb,"n");
      }
      textblock_append_c(tb,'\x0e'," %d",(ulong)uVar3);
      textblock_append(tb,"%% chance to hit such a creature in melee (if you can see it).  ");
    }
    return;
  }
  __assert_fail("tb && race && lore",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                ,0x429,
                "void lore_append_toughness(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
               );
}

Assistant:

void lore_append_toughness(textblock *tb, const struct monster_race *race,
						   const struct monster_lore *lore,
						   bitflag known_flags[RF_SIZE])
{
	monster_sex_t msex = MON_SEX_NEUTER;
	struct object *weapon = equipped_item_by_slot_name(player, "weapon");

	assert(tb && race && lore);

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Describe monster "toughness" */
	if (lore->armour_known) {
		/* Hitpoints */
		textblock_append(tb, "%s has a", lore_pronoun_nominative(msex, true));

		if (!rf_has(known_flags, RF_UNIQUE))
			textblock_append(tb, "n average");

		textblock_append(tb, " life rating of ");
		textblock_append_c(tb, COLOUR_L_BLUE, "%d", race->avg_hp);

		/* Armor */
		textblock_append(tb, ", and an armor rating of ");
		textblock_append_c(tb, COLOUR_L_BLUE, "%d", race->ac);
		textblock_append(tb, ".  ");

		/* Player's base chance to hit */
		random_chance c;
		hit_chance(&c, chance_of_melee_hit_base(player, weapon), race->ac);
		int percent = random_chance_scaled(c, 100);

		textblock_append(tb, "You have a");
		if (percent == 8 || percent / 10 == 8)
			textblock_append(tb, "n");
		textblock_append_c(tb, COLOUR_L_BLUE, " %d", percent);
		textblock_append(tb, "%% chance to hit such a creature in melee (if you can see it).  ");
	}
}